

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrWasmFunc<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  uint index;
  uint32 uVar1;
  WebAssemblyTable *this_00;
  Var pvVar2;
  int32 hCode;
  ScriptContext *scriptContext;
  
  this_00 = VarTo<Js::WebAssemblyTable>
                      (*(Var *)(*(long *)(this + 0x120) + (ulong)playout->Instance * 8));
  index = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  uVar1 = WebAssemblyTable::GetCurrentLength(this_00);
  if (index < uVar1) {
    pvVar2 = WebAssemblyTable::DirectGetValue(this_00,index);
    if (pvVar2 != (Var)0x0) {
      *(Var *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8) = pvVar2;
      return;
    }
    scriptContext = *(ScriptContext **)(this + 0x78);
    hCode = -0x7ff5e49b;
  }
  else {
    scriptContext = *(ScriptContext **)(this + 0x78);
    hCode = -0x7ff5e498;
  }
  JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext,hCode,(PCWSTR)0x0);
}

Assistant:

void InterpreterStackFrame::OP_LdArrWasmFunc(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        WebAssemblyTable * table = VarTo<WebAssemblyTable>(GetRegRawPtr(playout->Instance));
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        if (index >= table->GetCurrentLength())
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_TableIndexOutOfRange);
        }
        Var func = table->DirectGetValue(index);
        if (!func)
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_NeedWebAssemblyFunc);
        }
        SetRegRawPtr(playout->Value, func);
#endif
    }